

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

void substitute_args(List *argval,List *argname,List *expr)

{
  TokenType TVar1;
  bool bVar2;
  ListStruct *pLVar3;
  ListStruct *pLVar4;
  anon_union_8_7_0ba269be_for_u aVar5;
  char *pcVar6;
  unsigned_long uVar7;
  ListStruct **ppLVar8;
  undefined4 uVar9;
  BOOL BVar10;
  ListStruct *pLVar11;
  List *pLVar12;
  ListStruct *ls;
  ListStruct *pLVar13;
  bool bVar14;
  
  pLVar11 = argname;
  ls = argval;
  if (argname == (List *)0x0) {
    bVar2 = true;
  }
  else {
    do {
      bVar14 = (pLVar11->token).type == TOK_TAIL;
      bVar2 = !bVar14;
      if (bVar14) goto LAB_001086da;
      ppLVar8 = &pLVar11->cdr;
      pLVar11 = *ppLVar8;
      ls = ls->cdr;
    } while (*ppLVar8 != (ListStruct *)0x0);
  }
  ls = (List *)0x0;
LAB_001086da:
  if (expr != (List *)0x0) {
    do {
      TVar1 = (expr->token).type;
      if (TVar1 == TOK_LIST) {
        substitute_args(argval,argname,expr->car);
      }
      else if (TVar1 == TOK_TAIL) {
        if (bVar2) {
          parse_error(expr,"But this macro has no tail!\n");
        }
        pLVar12 = copy_list(ls);
        replace_list(expr,pLVar12);
      }
      else if ((TVar1 == TOK_IDENTIFIER) && (argval != (List *)0x0 && argname != (List *)0x0)) {
        pLVar11 = argname;
        pLVar13 = argval;
        do {
          TVar1 = (pLVar11->token).type;
          if (((TVar1 == TOK_TAIL) || (TVar1 == TOK_IDENTIFIER)) &&
             (BVar10 = tokens_equal(&pLVar11->token,&expr->token), BVar10 != FALSE)) {
            pLVar11 = expr->cdr;
            pLVar3 = pLVar13->cdr;
            pLVar4 = pLVar13->car;
            uVar9 = *(undefined4 *)&(pLVar13->token).field_0x4;
            aVar5 = (pLVar13->token).u;
            pcVar6 = (pLVar13->token).filename;
            uVar7 = (pLVar13->token).lineno;
            (expr->token).type = (pLVar13->token).type;
            *(undefined4 *)&(expr->token).field_0x4 = uVar9;
            (expr->token).u = aVar5;
            (expr->token).filename = pcVar6;
            (expr->token).lineno = uVar7;
            expr->cdr = pLVar3;
            expr->car = pLVar4;
            pLVar12 = copy_list(pLVar13->car);
            expr->car = pLVar12;
            expr->cdr = pLVar11;
            goto LAB_00108797;
          }
          pLVar11 = pLVar11->cdr;
        } while ((pLVar11 != (ListStruct *)0x0) &&
                (pLVar13 = pLVar13->cdr, pLVar13 != (ListStruct *)0x0));
      }
      pLVar11 = expr->cdr;
LAB_00108797:
      expr = pLVar11;
    } while (pLVar11 != (ListStruct *)0x0);
  }
  return;
}

Assistant:

static void
substitute_args (const List *argval, const List *argname, List *expr)
{
  const List *name, *val, *tail = NULL;
  BOOL has_tail = FALSE;

#ifdef DEBUG
  List *original_expr = expr;

  printf ("substitute_args: ");
  printf ("argval  = ");   print_list (argval, stdout);
  printf ("\nargname = "); print_list (argname, stdout);
  printf ("\nexpr    = "); print_list (expr, stdout);
  putchar ('\n');
#endif

  /* See if there is a +tail, and make it tail point to the list of args. */
  for (name = argname, val = argval; name != NULL;
       name = name->cdr, val = val->cdr)
    if (name->token.type == TOK_TAIL)
      {
	tail = val;
	has_tail = TRUE;
	break;
      }


  for (; expr != NULL; expr = expr->cdr)
    {
      switch (expr->token.type) {
      case TOK_LIST:
	substitute_args (argval, argname, expr->car);
	break;
      case TOK_IDENTIFIER:
	for (name = argname, val = argval; name != NULL && val != NULL;
	     name = name->cdr, val = val->cdr)
	  if (!IS_LITERAL (name) && tokens_equal (&name->token, &expr->token))
	    {
	      List *tmp_cdr = expr->cdr;
	      *expr = *val;
	      expr->car = copy_list (val->car);
	      expr->cdr = tmp_cdr;
	      break;
	    }
	break;
      case TOK_TAIL:
	if (!has_tail)
	  parse_error (expr, "But this macro has no tail!\n");
	replace_list (expr, copy_list (tail));
	break;

      default: break;
      }
    }

#ifdef DEBUG
  printf ("*** expr after argument substitutions:\n");
  print_list (original_expr, stdout);
  putchar ('\n');
#endif

}